

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_get_system_colors.cxx
# Opt level: O3

void Fl::background(uchar r,uchar g,uchar b)

{
  byte bVar1;
  Fl_Color i;
  undefined7 in_register_00000039;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  
  fl_bg_set = 1;
  dVar2 = 1.0;
  if ((int)CONCAT71(in_register_00000039,r) != 0) {
    bVar1 = 0xfe;
    if (r < 0xfe) {
      bVar1 = r;
    }
    dVar2 = (double)bVar1;
  }
  dVar2 = log(dVar2 / 255.0);
  dVar3 = 1.0;
  if (g != '\0') {
    bVar1 = 0xfe;
    if (g < 0xfe) {
      bVar1 = g;
    }
    dVar3 = (double)bVar1;
  }
  dVar3 = log(dVar3 / 255.0);
  dVar4 = 1.0;
  if (b != '\0') {
    bVar1 = 0xfe;
    if (b < 0xfe) {
      bVar1 = b;
    }
    dVar4 = (double)bVar1;
  }
  dVar4 = log(dVar4 / 255.0);
  dVar8 = 0.0;
  i = 0x20;
  do {
    dVar5 = dVar8 / 23.0;
    dVar6 = pow(dVar5,dVar2 / -0.3022808718729337);
    dVar7 = pow(dVar5,dVar3 / -0.3022808718729337);
    dVar5 = pow(dVar5,dVar4 / -0.3022808718729337);
    set_color(i,(uchar)(int)(dVar6 * 255.0 + 0.5),(uchar)(int)(dVar7 * 255.0 + 0.5),
              (uchar)(int)(dVar5 * 255.0 + 0.5));
    dVar8 = dVar8 + 1.0;
    i = i + 1;
  } while (i != 0x38);
  return;
}

Assistant:

void Fl::background(uchar r, uchar g, uchar b) {
  fl_bg_set = 1;

  // replace the gray ramp so that FL_GRAY is this color
  if (!r) r = 1; else if (r==255) r = 254;
  double powr = log(r/255.0)/log((FL_GRAY-FL_GRAY_RAMP)/(FL_NUM_GRAY-1.0));
  if (!g) g = 1; else if (g==255) g = 254;
  double powg = log(g/255.0)/log((FL_GRAY-FL_GRAY_RAMP)/(FL_NUM_GRAY-1.0));
  if (!b) b = 1; else if (b==255) b = 254;
  double powb = log(b/255.0)/log((FL_GRAY-FL_GRAY_RAMP)/(FL_NUM_GRAY-1.0));
  for (int i = 0; i < FL_NUM_GRAY; i++) {
    double gray = i/(FL_NUM_GRAY-1.0);
    Fl::set_color(fl_gray_ramp(i),
		  uchar(pow(gray,powr)*255+.5),
		  uchar(pow(gray,powg)*255+.5),
		  uchar(pow(gray,powb)*255+.5));
  }
}